

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VertexBuffer.cpp
# Opt level: O3

bool sf::VertexBuffer::isAvailable(void)

{
  bool bVar1;
  TransientContextLock contextLock;
  Lock lock;
  TransientContextLock local_11;
  Lock local_10;
  
  Lock::Lock(&local_10,(Mutex *)&(anonymous_namespace)::isAvailableMutex);
  if (isAvailable()::checked == '\0') {
    isAvailable()::checked = '\x01';
    GlResource::TransientContextLock::TransientContextLock(&local_11);
    priv::ensureExtensionsInit();
    isAvailable::available = sfogl_ext_ARB_vertex_buffer_object != 0;
    GlResource::TransientContextLock::~TransientContextLock(&local_11);
  }
  bVar1 = isAvailable::available;
  Lock::~Lock(&local_10);
  return bVar1;
}

Assistant:

bool VertexBuffer::isAvailable()
{
    Lock lock(isAvailableMutex);

    static bool checked = false;
    static bool available = false;

    if (!checked)
    {
        checked = true;

        TransientContextLock contextLock;

        // Make sure that extensions are initialized
        sf::priv::ensureExtensionsInit();

        available = GLEXT_vertex_buffer_object;
    }

    return available;
}